

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneevent.cpp
# Opt level: O2

void __thiscall
QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent(QGraphicsSceneMouseEvent *this,Type type)

{
  QGraphicsSceneEventPrivate *dd;
  
  dd = (QGraphicsSceneEventPrivate *)operator_new(0xa0);
  dd->timestamp = 0;
  dd->widget = (QWidget *)0x0;
  dd->q_ptr = (QGraphicsSceneEvent *)0x0;
  dd->_vptr_QGraphicsSceneEventPrivate =
       (_func_int **)&PTR__QGraphicsSceneMouseEventPrivate_007eddb8;
  dd[1]._vptr_QGraphicsSceneEventPrivate = (_func_int **)0x0;
  dd[1].widget = (QWidget *)0x0;
  dd[1].q_ptr = (QGraphicsSceneEvent *)0x0;
  dd[1].timestamp = 0;
  dd[2]._vptr_QGraphicsSceneEventPrivate = (_func_int **)0x0;
  dd[2].widget = (QWidget *)0x0;
  dd[2].q_ptr = (QGraphicsSceneEvent *)0x0;
  dd[2].timestamp = 0;
  dd[3]._vptr_QGraphicsSceneEventPrivate = (_func_int **)0x0;
  dd[3].widget = (QWidget *)0x0;
  dd[3].q_ptr = (QGraphicsSceneEvent *)0x0;
  dd[3].timestamp = 0;
  dd[4]._vptr_QGraphicsSceneEventPrivate = (_func_int **)0x0;
  dd[4].widget = (QWidget *)0x0;
  *(undefined8 *)((long)&dd[4].widget + 4) = 0;
  *(undefined8 *)((long)&dd[4].q_ptr + 4) = 0;
  QGraphicsSceneEvent::QGraphicsSceneEvent(&this->super_QGraphicsSceneEvent,dd,type);
  *(undefined ***)&this->super_QGraphicsSceneEvent = &PTR__QGraphicsSceneHelpEvent_007edb30;
  return;
}

Assistant:

QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent(Type type)
    : QGraphicsSceneEvent(*new QGraphicsSceneMouseEventPrivate, type)
{
}